

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

int hts_idx_load_core(hts_idx_t *idx,void *fp,int fmt)

{
  bins_t *pbVar1;
  int iVar2;
  uint uVar3;
  lidx_t *plVar4;
  khint_t kVar5;
  kh_bin_t *h;
  size_t sVar6;
  ssize_t sVar7;
  hts_pair64_t *data;
  uint64_t *puVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int32_t n;
  uint32_t key;
  int absent;
  int local_58;
  khint32_t local_54;
  hts_idx_t *local_50;
  int local_48;
  int local_44;
  lidx_t *local_40;
  long local_38;
  
  if (idx == (hts_idx_t *)0x0) {
    iVar10 = -4;
  }
  else {
    if (0 < idx->n) {
      lVar11 = 0;
      local_50 = idx;
      do {
        local_40 = idx->lidx + lVar11;
        h = (kh_bin_t *)calloc(1,0x28);
        idx->bidx[lVar11] = h;
        local_38 = lVar11;
        if (fmt == 1) {
          sVar6 = fread(&local_58,1,4,(FILE *)fp);
        }
        else {
          sVar6 = bgzf_read((BGZF *)fp,&local_58,4);
        }
        if (sVar6 != 4) {
          return -1;
        }
        if (0 < local_58) {
          iVar10 = 0;
          do {
            if (fmt == 1) {
              sVar6 = fread(&local_54,1,4,(FILE *)fp);
            }
            else {
              sVar6 = bgzf_read((BGZF *)fp,&local_54,4);
            }
            if (sVar6 != 4) {
              return -1;
            }
            kVar5 = kh_put_bin(h,local_54,&local_44);
            if (local_44 < 1) {
              return -3;
            }
            pbVar1 = h->vals + kVar5;
            if (fmt == 0) {
              sVar7 = bgzf_read((BGZF *)fp,&h->vals[kVar5].loff,8);
              if (sVar7 != 8) {
                return -1;
              }
LAB_0010e4e4:
              sVar6 = bgzf_read((BGZF *)fp,&pbVar1->n,4);
            }
            else {
              pbVar1->loff = 0;
              if (fmt != 1) goto LAB_0010e4e4;
              sVar6 = fread(&pbVar1->n,1,4,(FILE *)fp);
            }
            if (sVar6 != 4) {
              return -1;
            }
            iVar2 = pbVar1->n;
            pbVar1->m = iVar2;
            local_48 = iVar10;
            data = (hts_pair64_t *)malloc((long)iVar2 << 4);
            pbVar1->list = data;
            if (data == (hts_pair64_t *)0x0) {
              return -2;
            }
            if (fmt == 1) {
              sVar6 = fread(data,1,(long)(iVar2 << 4),(FILE *)fp);
            }
            else {
              sVar6 = bgzf_read((BGZF *)fp,data,(long)(iVar2 << 4));
            }
            if (sVar6 != (long)(pbVar1->n << 4)) {
              return -1;
            }
            iVar10 = local_48 + 1;
          } while (iVar10 < local_58);
        }
        plVar4 = local_40;
        idx = local_50;
        lVar11 = local_38;
        if (fmt != 0) {
          if (fmt == 1) {
            sVar6 = fread(local_40,1,4,(FILE *)fp);
          }
          else {
            sVar6 = bgzf_read((BGZF *)fp,local_40,4);
          }
          if (sVar6 != 4) {
            return -1;
          }
          iVar10 = plVar4->n;
          plVar4->m = iVar10;
          puVar8 = (uint64_t *)malloc((long)iVar10 << 3);
          plVar4->offset = puVar8;
          if (puVar8 == (uint64_t *)0x0) {
            return -2;
          }
          if (fmt == 1) {
            sVar6 = fread(puVar8,1,(long)(iVar10 * 8),(FILE *)fp);
          }
          else {
            sVar6 = bgzf_read((BGZF *)fp,puVar8,(long)(iVar10 * 8));
          }
          lVar11 = local_38;
          idx = local_50;
          uVar3 = plVar4->n;
          if (sVar6 != (long)(int)(uVar3 * 8)) {
            return -1;
          }
          if (1 < (int)uVar3) {
            puVar8 = plVar4->offset;
            uVar9 = 1;
            do {
              if (puVar8[uVar9] == 0) {
                puVar8[uVar9] = puVar8[uVar9 - 1];
              }
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
          update_loff(local_50,(int)local_38,1);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < idx->n);
    }
    puVar8 = &idx->n_no_coor;
    if (fmt == 1) {
      sVar6 = fread(puVar8,1,8,(FILE *)fp);
    }
    else {
      sVar6 = bgzf_read((BGZF *)fp,puVar8,8);
    }
    iVar10 = 0;
    if (sVar6 != 8) {
      *puVar8 = 0;
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

static int hts_idx_load_core(hts_idx_t *idx, void *fp, int fmt)
{
    int32_t i, n, is_be;
    int is_bgzf = (fmt != HTS_FMT_BAI);
    is_be = ed_is_big();
    if (idx == NULL) return -4;
    for (i = 0; i < idx->n; ++i) {
        bidx_t *h;
        lidx_t *l = &idx->lidx[i];
        uint32_t key;
        int j, absent;
        bins_t *p;
        h = idx->bidx[i] = kh_init(bin);
        if (idx_read(is_bgzf, fp, &n, 4) != 4) return -1;
        if (is_be) ed_swap_4p(&n);
        for (j = 0; j < n; ++j) {
            khint_t k;
            if (idx_read(is_bgzf, fp, &key, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&key);
            k = kh_put(bin, h, key, &absent);
            if (absent <= 0) return -3; // Duplicate bin number
            p = &kh_val(h, k);
            if (fmt == HTS_FMT_CSI) {
                if (idx_read(is_bgzf, fp, &p->loff, 8) != 8) return -1;
                if (is_be) ed_swap_8p(&p->loff);
            } else p->loff = 0;
            if (idx_read(is_bgzf, fp, &p->n, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&p->n);
            p->m = p->n;
            p->list = (hts_pair64_t*)malloc(p->m * sizeof(hts_pair64_t));
            if (p->list == NULL) return -2;
            if (idx_read(is_bgzf, fp, p->list, p->n<<4) != p->n<<4) return -1;
            if (is_be) swap_bins(p);
        }
        if (fmt != HTS_FMT_CSI) { // load linear index
            int j;
            if (idx_read(is_bgzf, fp, &l->n, 4) != 4) return -1;
            if (is_be) ed_swap_4p(&l->n);
            l->m = l->n;
            l->offset = (uint64_t*)malloc(l->n * sizeof(uint64_t));
            if (l->offset == NULL) return -2;
            if (idx_read(is_bgzf, fp, l->offset, l->n << 3) != l->n << 3) return -1;
            if (is_be) for (j = 0; j < l->n; ++j) ed_swap_8p(&l->offset[j]);
            for (j = 1; j < l->n; ++j) // fill missing values; may happen given older samtools and tabix
                if (l->offset[j] == 0) l->offset[j] = l->offset[j-1];
            update_loff(idx, i, 1);
        }
    }
    if (idx_read(is_bgzf, fp, &idx->n_no_coor, 8) != 8) idx->n_no_coor = 0;
    if (is_be) ed_swap_8p(&idx->n_no_coor);
    return 0;
}